

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiID IVar1;
  uint uVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImDrawList *this;
  ImGuiWindow *pIVar7;
  ImGuiContext *g;
  
  pIVar5 = GImGui;
  if ((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
       (GImGui->HoveredIdAllowOverlap == true)) &&
      (pIVar7 = GImGui->CurrentWindow, GImGui->HoveredWindow == pIVar7)) &&
     ((IVar1 = GImGui->ActiveId, IVar1 == id || IVar1 == 0 || (GImGui->ActiveIdAllowOverlap == true)
      ))) {
    bVar6 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar6) {
      uVar2 = (&pIVar5->CurrentItemFlags)[(ulong)((pIVar5->LastItemData).ID == id) * 8];
      if ((((uVar2 >> 8 & 1) == 0) && (pIVar5->NavWindow != (ImGuiWindow *)0x0)) &&
         ((pIVar4 = pIVar5->NavWindow->RootWindow, pIVar4 != (ImGuiWindow *)0x0 &&
          ((((pIVar4->WasActive == true && (pIVar7 = pIVar7->RootWindow, pIVar4 != pIVar7)) &&
            ((pIVar4->Flags & 0xc000000) != 0)) && (pIVar7->RootWindow != pIVar4)))))) {
        do {
          if (pIVar7 == pIVar4) goto LAB_001e14d5;
          pIVar7 = pIVar7->ParentWindowInBeginStack;
        } while (pIVar7 != (ImGuiWindow *)0x0);
      }
      else {
LAB_001e14d5:
        if (id == 0) {
          if ((uVar2 & 4) == 0) goto LAB_001e1552;
        }
        else {
          pIVar5->HoveredId = id;
          pIVar5->HoveredIdAllowOverlap = false;
          IVar3 = pIVar5->HoveredIdPreviousFrame;
          if (IVar3 != id) {
            pIVar5->HoveredIdTimer = 0.0;
            pIVar5->HoveredIdNotActiveTimer = 0.0;
          }
          if ((uVar2 & 4) == 0) {
            if ((IVar3 == id) && (pIVar5->DebugItemPickerActive != false)) {
              this = GetViewportDrawList(*(pIVar5->Viewports).Data,1,"##Foreground");
              ImDrawList::AddRect(this,&bb->Min,&bb->Max,0xff00ffff,0.0,0,1.0);
            }
LAB_001e1552:
            return (bool)(pIVar5->NavDisableMouseHover ^ 1);
          }
        }
        if (IVar1 == id) {
          SetActiveID(0,(ImGuiWindow *)0x0);
        }
      }
      pIVar5->HoveredIdDisabled = true;
    }
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;

    // Done with rectangle culling so we can perform heavier checks now.
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (!(item_flags & ImGuiItemFlags_NoWindowHoverableCheck) && !IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we performed the test in ItemAdd(), but that would incur a small runtime cost.
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        //if (g.DebugItemPickerBreakId == id)
        //    IM_DEBUG_BREAK();
    }

    if (g.NavDisableMouseHover)
        return false;

    return true;
}